

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitagg.cpp
# Opt level: O3

AggregateFunctionSet * duckdb::BitXorFun::GetFunctions(void)

{
  InternalException *this;
  LogicalType *in_RCX;
  AggregateFunctionSet *in_RDI;
  FunctionNullHandling in_R8B;
  pointer pLVar1;
  undefined1 *local_318 [2];
  undefined1 local_308 [16];
  AggregateFunctionSet *local_2f8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2f0;
  LogicalType local_2d8 [24];
  undefined1 local_2c0 [24];
  undefined1 local_2a8 [24];
  undefined **local_290 [37];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  undefined **local_160 [37];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  duckdb::AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  duckdb::LogicalType::Integral();
  if (local_2f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_2f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_2f8 = in_RDI + 0x20;
    pLVar1 = local_2f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      duckdb::LogicalType::LogicalType((LogicalType *)local_2a8,pLVar1);
      if ((byte)local_2a8[0] < 0x1c) {
        switch(local_2a8[0]) {
        case (BaseScalarFunction)0xb:
          duckdb::LogicalType::LogicalType((LogicalType *)local_318,(LogicalType *)local_2a8);
          in_RCX = (LogicalType *)0x0;
          AggregateFunction::
          UnaryAggregate<duckdb::BitState<unsigned_char>,signed_char,signed_char,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                    ((AggregateFunction *)local_160,(AggregateFunction *)local_2a8,
                     (LogicalType *)local_318,(LogicalType *)0x0,in_R8B);
          break;
        case (BaseScalarFunction)0xc:
          duckdb::LogicalType::LogicalType((LogicalType *)local_318,(LogicalType *)local_2a8);
          in_RCX = (LogicalType *)0x0;
          AggregateFunction::
          UnaryAggregate<duckdb::BitState<unsigned_short>,short,short,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                    ((AggregateFunction *)local_160,(AggregateFunction *)local_2a8,
                     (LogicalType *)local_318,(LogicalType *)0x0,in_R8B);
          break;
        case (BaseScalarFunction)0xd:
          duckdb::LogicalType::LogicalType((LogicalType *)local_318,(LogicalType *)local_2a8);
          in_RCX = (LogicalType *)0x0;
          AggregateFunction::
          UnaryAggregate<duckdb::BitState<unsigned_int>,int,int,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                    ((AggregateFunction *)local_160,(AggregateFunction *)local_2a8,
                     (LogicalType *)local_318,(LogicalType *)0x0,in_R8B);
          break;
        case (BaseScalarFunction)0xe:
          duckdb::LogicalType::LogicalType((LogicalType *)local_318,(LogicalType *)local_2a8);
          in_RCX = (LogicalType *)0x0;
          AggregateFunction::
          UnaryAggregate<duckdb::BitState<unsigned_long>,long,long,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                    ((AggregateFunction *)local_160,(AggregateFunction *)local_2a8,
                     (LogicalType *)local_318,(LogicalType *)0x0,in_R8B);
          break;
        default:
switchD_00401b3c_default:
          this = (InternalException *)__cxa_allocate_exception(0x10);
          local_318[0] = local_308;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_318,"Unimplemented bitfield type for unary aggregate","");
          duckdb::InternalException::InternalException(this,(string *)local_318);
          __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        switch(local_2a8[0]) {
        case (BaseScalarFunction)0x1c:
          duckdb::LogicalType::LogicalType((LogicalType *)local_318,(LogicalType *)local_2a8);
          in_RCX = (LogicalType *)0x0;
          AggregateFunction::
          UnaryAggregate<duckdb::BitState<unsigned_char>,unsigned_char,unsigned_char,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                    ((AggregateFunction *)local_160,(AggregateFunction *)local_2a8,
                     (LogicalType *)local_318,(LogicalType *)0x0,in_R8B);
          break;
        case (BaseScalarFunction)0x1d:
          duckdb::LogicalType::LogicalType((LogicalType *)local_318,(LogicalType *)local_2a8);
          in_RCX = (LogicalType *)0x0;
          AggregateFunction::
          UnaryAggregate<duckdb::BitState<unsigned_short>,unsigned_short,unsigned_short,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                    ((AggregateFunction *)local_160,(AggregateFunction *)local_2a8,
                     (LogicalType *)local_318,(LogicalType *)0x0,in_R8B);
          break;
        case (BaseScalarFunction)0x1e:
          duckdb::LogicalType::LogicalType((LogicalType *)local_318,(LogicalType *)local_2a8);
          in_RCX = (LogicalType *)0x0;
          AggregateFunction::
          UnaryAggregate<duckdb::BitState<unsigned_int>,unsigned_int,unsigned_int,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                    ((AggregateFunction *)local_160,(AggregateFunction *)local_2a8,
                     (LogicalType *)local_318,(LogicalType *)0x0,in_R8B);
          break;
        case (BaseScalarFunction)0x1f:
          duckdb::LogicalType::LogicalType((LogicalType *)local_318,(LogicalType *)local_2a8);
          in_RCX = (LogicalType *)0x0;
          AggregateFunction::
          UnaryAggregate<duckdb::BitState<unsigned_long>,unsigned_long,unsigned_long,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                    ((AggregateFunction *)local_160,(AggregateFunction *)local_2a8,
                     (LogicalType *)local_318,(LogicalType *)0x0,in_R8B);
          break;
        default:
          if (local_2a8[0] == (BaseScalarFunction)0x31) {
            duckdb::LogicalType::LogicalType((LogicalType *)local_318,(LogicalType *)local_2a8);
            in_RCX = (LogicalType *)0x0;
            AggregateFunction::
            UnaryAggregate<duckdb::BitState<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                      ((AggregateFunction *)local_160,(AggregateFunction *)local_2a8,
                       (LogicalType *)local_318,(LogicalType *)0x0,in_R8B);
          }
          else {
            if (local_2a8[0] != (BaseScalarFunction)0x32) goto switchD_00401b3c_default;
            duckdb::LogicalType::LogicalType((LogicalType *)local_318,(LogicalType *)local_2a8);
            in_RCX = (LogicalType *)0x0;
            AggregateFunction::
            UnaryAggregate<duckdb::BitState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                      ((AggregateFunction *)local_160,(AggregateFunction *)local_2a8,
                       (LogicalType *)local_318,(LogicalType *)0x0,in_R8B);
          }
        }
      }
      duckdb::LogicalType::~LogicalType((LogicalType *)local_318);
      std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                 local_2f8,(AggregateFunction *)local_160);
      local_160[0] = &PTR__AggregateFunction_00890e90;
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
      duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_160);
      duckdb::LogicalType::~LogicalType((LogicalType *)local_2a8);
      pLVar1 = pLVar1 + 0x18;
    } while (pLVar1 != local_2f0.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2f0);
  duckdb::LogicalType::LogicalType((LogicalType *)local_2c0,BIT);
  duckdb::LogicalType::LogicalType(local_2d8,BIT);
  AggregateFunction::
  UnaryAggregateDestructor<duckdb::BitState<duckdb::string_t>,duckdb::string_t,duckdb::string_t,duckdb::BitStringXorOperation,(duckdb::AggregateDestructorType)0>
            ((AggregateFunction *)local_290,(AggregateFunction *)local_2c0,local_2d8,in_RCX);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
             (in_RDI + 0x20),(AggregateFunction *)local_290);
  local_290[0] = &PTR__AggregateFunction_00890e90;
  if (local_168._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_168._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_290);
  duckdb::LogicalType::~LogicalType(local_2d8);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_2c0);
  return in_RDI;
}

Assistant:

AggregateFunctionSet BitXorFun::GetFunctions() {
	AggregateFunctionSet bit_xor;
	for (auto &type : LogicalType::Integral()) {
		bit_xor.AddFunction(GetBitfieldUnaryAggregate<BitXorOperation>(type));
	}
	bit_xor.AddFunction(
	    AggregateFunction::UnaryAggregateDestructor<BitState<string_t>, string_t, string_t, BitStringXorOperation>(
	        LogicalType::BIT, LogicalType::BIT));
	return bit_xor;
}